

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_diag_avx2_256_64.c
# Opt level: O0

parasail_result_t *
parasail_nw_stats_table_diag_avx2_256_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  long lVar1;
  long lVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  __m256i vWH_00;
  __m256i vWH_01;
  __m256i vWH_02;
  __m256i vWH_03;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  int iVar53;
  int iVar54;
  long lVar55;
  ulong uVar56;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  long lVar57;
  int64_t iVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  int *array;
  int64_t iVar62;
  long lVar63;
  int64_t iVar64;
  long lVar65;
  int in_ECX;
  long lVar66;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  long lVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar78 [16];
  long lVar80;
  long lVar81;
  long lVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [32];
  long lVar85;
  long lVar86;
  long lVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  long in_stack_00000008;
  int64_t value;
  __m256i cond_all;
  __m256i cond_valid_J;
  __m256i cond_valid_I;
  __m256i cond;
  __m256i vNWL;
  __m256i vNWS;
  __m256i vNWM;
  __m256i vNWH;
  __m256i vMat;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m256i vs2;
  __m256i vs1;
  __m256i vJ;
  __m256i vFL;
  __m256i vFS;
  __m256i vFM;
  __m256i vF_ext;
  __m256i vF_opn;
  __m256i vF;
  __m256i vEL;
  __m256i vES;
  __m256i vEM;
  __m256i vE_ext;
  __m256i vE_opn;
  __m256i vE;
  __m256i vWL;
  __m256i vWS;
  __m256i vWM;
  __m256i vWH;
  __m256i vNL;
  __m256i vNS;
  __m256i vNM;
  __m256i vNH;
  __m256i case2;
  __m256i case1;
  __m256i vIBoundary;
  __m256i vJLimit1;
  __m256i vJLimit;
  __m256i vILimit1;
  __m256i vILimit;
  __m256i vMaxL;
  __m256i vMaxS;
  __m256i vMaxM;
  __m256i vMaxH;
  __m256i vJreset;
  __m256i vI;
  __m256i vNegOne;
  __m256i vGapN;
  __m256i vN;
  __m256i vOne;
  __m256i vNegInf0;
  __m256i vZero;
  __m256i vGap;
  __m256i vOpen;
  __m256i vNegInf;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int64_t length;
  int64_t similar;
  int64_t matches;
  int64_t score;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int64_t *FL_pr;
  int64_t *FS_pr;
  int64_t *FM_pr;
  int64_t *F_pr;
  int64_t *HL_pr;
  int64_t *HS_pr;
  int64_t *HM_pr;
  int64_t *H_pr;
  int64_t *s2;
  int64_t *_FL_pr;
  int64_t *_FS_pr;
  int64_t *_FM_pr;
  int64_t *_F_pr;
  int64_t *_HL_pr;
  int64_t *_HS_pr;
  int64_t *_HM_pr;
  int64_t *_H_pr;
  int64_t *s2B;
  int64_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int32_t in_stack_ffffffffffffdfc8;
  int in_stack_ffffffffffffdfcc;
  long lVar125;
  undefined4 in_stack_ffffffffffffdfe8;
  int in_stack_ffffffffffffdfec;
  int local_1ff4;
  long local_1ff0;
  long lVar126;
  undefined4 in_stack_ffffffffffffe028;
  int in_stack_ffffffffffffe02c;
  long lVar127;
  undefined4 in_stack_ffffffffffffe050;
  long local_1ec0;
  long lStack_1eb8;
  long lStack_1eb0;
  long lStack_1ea8;
  undefined1 local_1e60 [24];
  long lStack_1e48;
  long local_1e40;
  long lStack_1e38;
  long lStack_1e30;
  long lStack_1e28;
  undefined1 local_1e20 [32];
  undefined1 local_1e00 [24];
  undefined8 uStack_1de8;
  undefined1 local_1de0 [24];
  undefined8 uStack_1dc8;
  undefined1 local_1dc0 [24];
  undefined8 uStack_1da8;
  long local_1d80;
  long lStack_1d78;
  long lStack_1d70;
  long lStack_1d68;
  undefined1 local_1d60 [24];
  long lStack_1d48;
  undefined1 local_1d40 [32];
  undefined1 local_1d20 [32];
  undefined1 local_1d00 [32];
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined1 local_1ca0 [32];
  undefined1 local_1c80 [24];
  undefined8 uStack_1c68;
  undefined1 local_1c60 [24];
  undefined8 uStack_1c48;
  undefined1 local_1c40 [24];
  undefined8 uStack_1c28;
  undefined1 local_1c20 [24];
  undefined8 uStack_1c08;
  undefined1 local_1c00 [32];
  undefined1 local_1be0 [32];
  undefined1 local_1bc0 [32];
  undefined1 local_1ba0 [32];
  undefined1 local_1b60 [16];
  undefined1 local_1b40 [32];
  long local_1b20;
  long lStack_1b18;
  long lStack_1b10;
  long lStack_1b08;
  long local_1ae0;
  long lStack_1ad8;
  long lStack_1ad0;
  long lStack_1ac8;
  undefined1 local_1aa0 [32];
  undefined1 local_1a80 [32];
  undefined1 local_1a60 [32];
  undefined1 local_1a40 [32];
  undefined1 local_1a00 [32];
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  ulong local_1828;
  ulong local_1820;
  ulong local_1818;
  ulong local_1810;
  int local_17f8;
  int local_17f4;
  int local_17f0;
  int local_17ec;
  parasail_result_t *local_1708;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  long local_1460;
  long lStack_1458;
  long lStack_1450;
  long lStack_1448;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  
  if (in_RDX == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_diag_avx2_256_64","_s2");
    local_1708 = (parasail_result_t *)0x0;
  }
  else if (in_ECX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_table_diag_avx2_256_64","s2Len");
    local_1708 = (parasail_result_t *)0x0;
  }
  else if (in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_table_diag_avx2_256_64","open");
    local_1708 = (parasail_result_t *)0x0;
  }
  else if (in_R9D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_table_diag_avx2_256_64","gap");
    local_1708 = (parasail_result_t *)0x0;
  }
  else if (in_stack_00000008 == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_diag_avx2_256_64","matrix");
    local_1708 = (parasail_result_t *)0x0;
  }
  else {
    if (*(int *)(in_stack_00000008 + 0x30) == 1) {
      if (in_RDI == 0) {
        fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
                "parasail_nw_stats_table_diag_avx2_256_64");
        return (parasail_result_t *)0x0;
      }
    }
    else {
      if (in_RDI == 0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_diag_avx2_256_64","_s1");
        return (parasail_result_t *)0x0;
      }
      if (in_ESI < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_table_diag_avx2_256_64","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    if (*(int *)(in_stack_00000008 + 0x30) != 0) {
      in_ESI = *(int *)(in_stack_00000008 + 0x34);
    }
    local_17f4 = in_ESI + -1;
    local_17f8 = in_ECX + -1;
    if (-in_R8D < *(int *)(in_stack_00000008 + 0x20)) {
      lVar55 = (long)in_R8D;
    }
    else {
      lVar55 = -(long)*(int *)(in_stack_00000008 + 0x20);
    }
    lVar127 = lVar55 + -0x8000000000000000;
    local_1828 = lVar55 + 0x8000000000000001;
    uVar56 = 0x7ffffffffffffffe - (long)*(int *)(in_stack_00000008 + 0x1c);
    auVar68._8_8_ = 0;
    auVar68._0_8_ = local_1828;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = local_1828;
    auVar68 = vpunpcklqdq_avx(auVar68,auVar88);
    auVar89._8_8_ = 0;
    auVar89._0_8_ = local_1828;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = local_1828;
    auVar69 = vpunpcklqdq_avx(auVar89,auVar114);
    local_16a0 = auVar68._0_8_;
    uStack_1698 = auVar68._8_8_;
    uStack_1690 = auVar69._0_8_;
    uStack_1688 = auVar69._8_8_;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar56;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = uVar56;
    auVar69 = vpunpcklqdq_avx(auVar69,auVar90);
    auVar91._8_8_ = 0;
    auVar91._0_8_ = uVar56;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uVar56;
    auVar70 = vpunpcklqdq_avx(auVar91,auVar115);
    local_1660 = auVar69._0_8_;
    uStack_1658 = auVar69._8_8_;
    uStack_1650 = auVar70._0_8_;
    uStack_1648 = auVar70._8_8_;
    local_18a0 = local_1660;
    uStack_1898 = uStack_1658;
    uStack_1890 = uStack_1650;
    uStack_1888 = uStack_1648;
    local_18c0 = local_16a0;
    uStack_18b8 = uStack_1698;
    uStack_18b0 = uStack_1690;
    uStack_18a8 = uStack_1688;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = local_1828;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = local_1828;
    auVar70 = vpunpcklqdq_avx(auVar70,auVar92);
    auVar93._8_8_ = 0;
    auVar93._0_8_ = local_1828;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = local_1828;
    auVar71 = vpunpcklqdq_avx(auVar93,auVar116);
    uStack_1610 = auVar71._0_8_;
    uStack_1608 = auVar71._8_8_;
    uVar56 = (ulong)in_R8D;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar56;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = uVar56;
    auVar71 = vpunpcklqdq_avx(auVar71,auVar94);
    auVar95._8_8_ = 0;
    auVar95._0_8_ = uVar56;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = uVar56;
    auVar72 = vpunpcklqdq_avx(auVar95,auVar117);
    uStack_15d0 = auVar72._0_8_;
    uStack_15c8 = auVar72._8_8_;
    uVar56 = (ulong)in_R9D;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar56;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar56;
    auVar72 = vpunpcklqdq_avx(auVar72,auVar96);
    auVar97._8_8_ = 0;
    auVar97._0_8_ = uVar56;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = uVar56;
    auVar88 = vpunpcklqdq_avx(auVar97,auVar118);
    uStack_1590 = auVar88._0_8_;
    uStack_1588 = auVar88._8_8_;
    auVar88 = vpunpcklqdq_avx(ZEXT816(0),ZEXT816(0));
    auVar89 = vpunpcklqdq_avx(ZEXT816(0),ZEXT816(0));
    uStack_1550 = auVar89._0_8_;
    uStack_1548 = auVar89._8_8_;
    auVar9._16_8_ = uStack_1550;
    auVar9._0_16_ = auVar88;
    auVar9._24_8_ = uStack_1548;
    auVar108._8_8_ = local_1828;
    auVar108._0_8_ = local_1828;
    auVar108._16_8_ = local_1828;
    auVar108._24_8_ = local_1828;
    auVar108 = vpblendd_avx2(auVar9,auVar108,0xc0);
    auVar89 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    auVar90 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    uStack_1510 = auVar90._0_8_;
    uStack_1508 = auVar90._8_8_;
    auVar90 = vpunpcklqdq_avx(ZEXT816(4),ZEXT816(4));
    auVar73 = vpunpcklqdq_avx(ZEXT816(4),ZEXT816(4));
    uStack_14d0 = auVar73._0_8_;
    uStack_14c8 = auVar73._8_8_;
    uVar56 = (ulong)(in_R9D * 4);
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar56;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uVar56;
    auVar73 = vpunpcklqdq_avx(auVar73,auVar98);
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uVar56;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uVar56;
    auVar91 = vpunpcklqdq_avx(auVar99,auVar119);
    uStack_1490 = auVar91._0_8_;
    uStack_1488 = auVar91._8_8_;
    auVar91 = vpunpcklqdq_avx(ZEXT816(0xffffffffffffffff),ZEXT816(0xffffffffffffffff));
    auVar84 = vpunpcklqdq_avx(ZEXT816(0xffffffffffffffff),ZEXT816(0xffffffffffffffff));
    local_1460 = auVar91._0_8_;
    lStack_1458 = auVar91._8_8_;
    lStack_1450 = auVar84._0_8_;
    lStack_1448 = auVar84._8_8_;
    local_1a00._0_16_ = vpunpcklqdq_avx(ZEXT816(3),ZEXT816(2));
    auVar91 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(0));
    uStack_1290 = auVar91._0_8_;
    uStack_1288 = auVar91._8_8_;
    local_1a00._16_8_ = uStack_1290;
    local_1a00._24_8_ = uStack_1288;
    auVar91 = vpunpcklqdq_avx(ZEXT816(0xfffffffffffffffd),ZEXT816(0xfffffffffffffffe));
    auVar84 = vpunpcklqdq_avx(ZEXT816(0xffffffffffffffff),ZEXT816(0));
    uStack_12d0 = auVar84._0_8_;
    uStack_12c8 = auVar84._8_8_;
    local_1a40._16_8_ = uStack_1610;
    local_1a40._0_16_ = auVar70;
    local_1a40._24_8_ = uStack_1608;
    local_1a60._16_8_ = uStack_1610;
    local_1a60._0_16_ = auVar70;
    local_1a60._24_8_ = uStack_1608;
    local_1a80._16_8_ = uStack_1610;
    local_1a80._0_16_ = auVar70;
    local_1a80._24_8_ = uStack_1608;
    local_1aa0._16_8_ = uStack_1610;
    local_1aa0._0_16_ = auVar70;
    local_1aa0._24_8_ = uStack_1608;
    uVar56 = (ulong)in_ESI;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar56;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar56;
    auVar84 = vpunpcklqdq_avx(auVar84,auVar100);
    auVar101._8_8_ = 0;
    auVar101._0_8_ = uVar56;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uVar56;
    auVar77 = vpunpcklqdq_avx(auVar101,auVar120);
    uStack_1410 = auVar77._0_8_;
    uStack_1408 = auVar77._8_8_;
    auVar6._16_8_ = uStack_1410;
    auVar6._0_16_ = auVar84;
    auVar6._24_8_ = uStack_1408;
    auVar7._16_8_ = uStack_1510;
    auVar7._0_16_ = auVar89;
    auVar7._24_8_ = uStack_1508;
    auVar9 = vpsubq_avx2(auVar6,auVar7);
    uVar56 = (ulong)in_ECX;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar56;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uVar56;
    auVar84 = vpunpcklqdq_avx(auVar77,auVar102);
    auVar103._8_8_ = 0;
    auVar103._0_8_ = uVar56;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = uVar56;
    auVar77 = vpunpcklqdq_avx(auVar103,auVar121);
    uStack_13d0 = auVar77._0_8_;
    uStack_13c8 = auVar77._8_8_;
    auVar8._16_8_ = uStack_13d0;
    auVar8._0_16_ = auVar84;
    auVar8._24_8_ = uStack_13c8;
    auVar10._16_8_ = uStack_1510;
    auVar10._0_16_ = auVar89;
    auVar10._24_8_ = uStack_1508;
    auVar10 = vpsubq_avx2(auVar8,auVar10);
    iVar54 = -in_R8D;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = (long)(iVar54 - in_R9D);
    auVar104._8_8_ = 0;
    auVar104._0_8_ = (long)iVar54;
    auVar84 = vpunpcklqdq_avx(auVar83,auVar104);
    auVar74._8_8_ = 0;
    auVar74._0_8_ = (long)(iVar54 + in_R9D * -3);
    auVar122._8_8_ = 0;
    auVar122._0_8_ = (long)(iVar54 + in_R9D * -2);
    auVar77 = vpunpcklqdq_avx(auVar74,auVar122);
    auVar83 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar84;
    uStack_1310 = auVar83._0_8_;
    uStack_1308 = auVar83._8_8_;
    local_1b40._16_8_ = uStack_1310;
    local_1b40._0_16_ = ZEXT116(0) * auVar84 + ZEXT116(1) * auVar77;
    local_1b40._24_8_ = uStack_1308;
    iVar54 = in_ESI;
    local_1708 = parasail_result_new_table3(in_ESI,in_ECX);
    if (local_1708 == (parasail_result_t *)0x0) {
      local_1708 = (parasail_result_t *)0x0;
    }
    else {
      local_1708->flag = local_1708->flag | 0x4811001;
      local_1708->flag = local_1708->flag | 0x20000;
      ptr = parasail_memalign_int64_t(0x20,(long)(in_ESI + 3));
      ptr_00 = parasail_memalign_int64_t(0x20,(long)(in_ECX + 6));
      ptr_01 = parasail_memalign_int64_t(0x20,(long)(in_ECX + 6));
      ptr_02 = parasail_memalign_int64_t(0x20,(long)(in_ECX + 6));
      ptr_03 = parasail_memalign_int64_t(0x20,(long)(in_ECX + 6));
      ptr_04 = parasail_memalign_int64_t(0x20,(long)(in_ECX + 6));
      ptr_05 = parasail_memalign_int64_t(0x20,(long)(in_ECX + 6));
      ptr_06 = parasail_memalign_int64_t(0x20,(long)(in_ECX + 6));
      ptr_07 = parasail_memalign_int64_t(0x20,(long)(in_ECX + 6));
      ptr_08 = parasail_memalign_int64_t(0x20,(long)(in_ECX + 6));
      if (ptr == (int64_t *)0x0) {
        local_1708 = (parasail_result_t *)0x0;
      }
      else if (ptr_00 == (int64_t *)0x0) {
        local_1708 = (parasail_result_t *)0x0;
      }
      else if (ptr_01 == (int64_t *)0x0) {
        local_1708 = (parasail_result_t *)0x0;
      }
      else if (ptr_02 == (int64_t *)0x0) {
        local_1708 = (parasail_result_t *)0x0;
      }
      else if (ptr_03 == (int64_t *)0x0) {
        local_1708 = (parasail_result_t *)0x0;
      }
      else if (ptr_04 == (int64_t *)0x0) {
        local_1708 = (parasail_result_t *)0x0;
      }
      else if (ptr_05 == (int64_t *)0x0) {
        local_1708 = (parasail_result_t *)0x0;
      }
      else if (ptr_06 == (int64_t *)0x0) {
        local_1708 = (parasail_result_t *)0x0;
      }
      else if (ptr_07 == (int64_t *)0x0) {
        local_1708 = (parasail_result_t *)0x0;
      }
      else if (ptr_08 == (int64_t *)0x0) {
        local_1708 = (parasail_result_t *)0x0;
      }
      else {
        for (local_17ec = 0; iVar53 = in_ESI, local_17ec < in_ESI; local_17ec = local_17ec + 1) {
          ptr[local_17ec] =
               (long)*(int *)(*(long *)(in_stack_00000008 + 0x10) +
                             (ulong)*(byte *)(in_RDI + local_17ec) * 4);
        }
        while (local_17ec = iVar53, local_17ec < in_ESI + 3) {
          ptr[local_17ec] = 0;
          iVar53 = local_17ec + 1;
        }
        for (local_17f0 = 0; local_17f0 < in_ECX; local_17f0 = local_17f0 + 1) {
          ptr_00[(long)local_17f0 + 3] =
               (long)*(int *)(*(long *)(in_stack_00000008 + 0x10) +
                             (ulong)*(byte *)(in_RDX + local_17f0) * 4);
        }
        for (local_17f0 = -3; iVar53 = in_ECX, local_17f0 < 0; local_17f0 = local_17f0 + 1) {
          ptr_00[(long)local_17f0 + 3] = 0;
        }
        while (local_17f0 = iVar53, local_17f0 < in_ECX + 3) {
          ptr_00[(long)local_17f0 + 3] = 0;
          iVar53 = local_17f0 + 1;
        }
        for (local_17f0 = 0; local_17f0 < in_ECX; local_17f0 = local_17f0 + 1) {
          ptr_01[(long)local_17f0 + 3] = (long)(-(local_17f0 * in_R9D) - in_R8D);
          ptr_02[(long)local_17f0 + 3] = 0;
          ptr_03[(long)local_17f0 + 3] = 0;
          ptr_04[(long)local_17f0 + 3] = 0;
          ptr_05[(long)local_17f0 + 3] = local_1828;
          ptr_06[(long)local_17f0 + 3] = 0;
          ptr_07[(long)local_17f0 + 3] = 0;
          ptr_08[(long)local_17f0 + 3] = 0;
        }
        for (local_17f0 = -3; iVar53 = in_ECX, local_17f0 < 0; local_17f0 = local_17f0 + 1) {
          ptr_01[(long)local_17f0 + 3] = 0;
          ptr_02[(long)local_17f0 + 3] = 0;
          ptr_03[(long)local_17f0 + 3] = 0;
          ptr_04[(long)local_17f0 + 3] = 0;
          ptr_05[(long)local_17f0 + 3] = 0;
          ptr_06[(long)local_17f0 + 3] = 0;
          ptr_07[(long)local_17f0 + 3] = 0;
          ptr_08[(long)local_17f0 + 3] = 0;
        }
        while (local_17f0 = iVar53, local_17f0 < in_ECX + 3) {
          ptr_01[(long)local_17f0 + 3] = 0;
          ptr_02[(long)local_17f0 + 3] = 0;
          ptr_03[(long)local_17f0 + 3] = 0;
          ptr_04[(long)local_17f0 + 3] = 0;
          ptr_05[(long)local_17f0 + 3] = 0;
          ptr_06[(long)local_17f0 + 3] = 0;
          ptr_07[(long)local_17f0 + 3] = 0;
          ptr_08[(long)local_17f0 + 3] = 0;
          iVar53 = local_17f0 + 1;
        }
        ptr_01[2] = 0;
        for (local_17ec = 0; local_17ec < in_ESI; local_17ec = local_17ec + 4) {
          local_1ba0._16_8_ = uStack_1550;
          local_1ba0._0_16_ = auVar88;
          local_1bc0._16_8_ = uStack_1550;
          local_1bc0._0_16_ = auVar88;
          local_1bc0._24_8_ = uStack_1548;
          local_1be0._16_8_ = uStack_1550;
          local_1be0._0_16_ = auVar88;
          local_1be0._24_8_ = uStack_1548;
          local_1c00._16_8_ = uStack_1550;
          local_1c00._0_16_ = auVar88;
          local_1c00._24_8_ = uStack_1548;
          local_1c20._16_8_ = uStack_1550;
          local_1c20._0_16_ = auVar88;
          uStack_1c08 = uStack_1548;
          local_1c40._16_8_ = uStack_1550;
          local_1c40._0_16_ = auVar88;
          uStack_1c28 = uStack_1548;
          local_1c60._16_8_ = uStack_1550;
          local_1c60._0_16_ = auVar88;
          uStack_1c48 = uStack_1548;
          local_1c80._16_8_ = uStack_1550;
          local_1c80._0_16_ = auVar88;
          uStack_1c68 = uStack_1548;
          local_1d00._16_8_ = uStack_1550;
          local_1d00._0_16_ = auVar88;
          local_1d00._24_8_ = uStack_1548;
          local_1d20._16_8_ = uStack_1550;
          local_1d20._0_16_ = auVar88;
          local_1d20._24_8_ = uStack_1548;
          local_1d40._16_8_ = uStack_1550;
          local_1d40._0_16_ = auVar88;
          local_1d40._24_8_ = uStack_1548;
          local_1dc0._16_8_ = uStack_1550;
          local_1dc0._0_16_ = auVar88;
          uStack_1da8 = uStack_1548;
          local_1de0._16_8_ = uStack_1550;
          local_1de0._0_16_ = auVar88;
          uStack_1dc8 = uStack_1548;
          local_1e00._16_8_ = uStack_1550;
          local_1e00._0_16_ = auVar88;
          uStack_1de8 = uStack_1548;
          local_1e20._16_8_ = uStack_12d0;
          local_1e20._0_16_ = auVar91;
          local_1e20._24_8_ = uStack_12c8;
          lVar55 = (long)local_17ec;
          auVar75._8_8_ = 0;
          auVar75._0_8_ = ptr[lVar55 + 1];
          auVar105._8_8_ = 0;
          auVar105._0_8_ = ptr[lVar55];
          auVar84 = vpunpcklqdq_avx(auVar75,auVar105);
          auVar76._8_8_ = 0;
          auVar76._0_8_ = ptr[lVar55 + 3];
          auVar123._8_8_ = 0;
          auVar123._0_8_ = ptr[lVar55 + 2];
          auVar77 = vpunpcklqdq_avx(auVar76,auVar123);
          auVar77 = ZEXT116(0) * auVar84 + ZEXT116(1) * auVar77;
          auVar84 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar84;
          local_1e60._16_8_ = uStack_1610;
          local_1e60._0_16_ = auVar70;
          lStack_1e48 = uStack_1608;
          lVar55 = *(long *)(in_stack_00000008 + 8);
          lVar57 = (long)*(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            iVar58 = ptr[local_17ec];
          }
          else {
            in_stack_ffffffffffffe02c = local_17ec;
            if (in_ESI <= local_17ec) {
              in_stack_ffffffffffffe02c = in_ESI + -1;
            }
            iVar58 = (int64_t)in_stack_ffffffffffffe02c;
          }
          lVar59 = lVar55 + lVar57 * iVar58 * 4;
          lVar126 = *(long *)(in_stack_00000008 + 8);
          lVar60 = (long)*(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1ff0 = ptr[local_17ec + 1];
          }
          else {
            if (local_17ec + 1 < in_ESI) {
              local_1ff4 = local_17ec + 1;
            }
            else {
              local_1ff4 = in_ESI + -1;
            }
            local_1ff0 = (long)local_1ff4;
          }
          lVar61 = lVar126 + lVar60 * local_1ff0 * 4;
          lVar2 = *(long *)(in_stack_00000008 + 8);
          array = (int *)(long)*(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            iVar62 = ptr[local_17ec + 2];
          }
          else {
            if (local_17ec + 2 < in_ESI) {
              in_stack_ffffffffffffdfec = local_17ec + 2;
            }
            else {
              in_stack_ffffffffffffdfec = in_ESI + -1;
            }
            iVar62 = (int64_t)in_stack_ffffffffffffdfec;
          }
          lVar66 = (long)array * iVar62;
          lVar125 = *(long *)(in_stack_00000008 + 8);
          lVar63 = (long)*(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            iVar64 = ptr[local_17ec + 3];
          }
          else {
            if (local_17ec + 3 < in_ESI) {
              in_stack_ffffffffffffdfcc = local_17ec + 3;
            }
            else {
              in_stack_ffffffffffffdfcc = in_ESI + -1;
            }
            iVar64 = (int64_t)in_stack_ffffffffffffdfcc;
          }
          lVar1 = lVar125 + lVar63 * iVar64 * 4;
          local_1ba0._24_8_ = ptr_01[2];
          lVar65 = (long)-(in_R8D + local_17ec * in_R9D);
          auVar109._8_8_ = lVar65;
          auVar109._0_8_ = lVar65;
          auVar109._16_8_ = lVar65;
          auVar109._24_8_ = lVar65;
          _local_1c20 = vpblendd_avx2(_local_1c20,auVar109,0xc0);
          ptr_01[2] = (long)(-((local_17ec + 4) * in_R9D) - in_R8D);
          local_17f0 = 0;
          _local_1d60 = auVar108;
          local_1ca0 = auVar108;
          while( true ) {
            auVar109 = local_1ba0;
            auVar6 = local_1bc0;
            auVar7 = local_1be0;
            auVar8 = local_1c00;
            lStack_1e28 = auVar84._8_8_;
            lStack_1e30 = auVar84._0_8_;
            lStack_1e38 = auVar77._8_8_;
            local_1e40 = auVar77._0_8_;
            if (in_ECX + 3 <= local_17f0) break;
            auVar110 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffe3f0),8);
            auVar79 = vpsrldq_avx2(_local_1c20,8);
            auVar79 = vpor_avx2(auVar110,auVar79);
            local_1ba0._0_24_ = auVar79._0_24_;
            local_1ba0._24_8_ = ptr_01[(long)local_17f0 + 3];
            auVar110 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffe3d0),8);
            auVar79 = vpsrldq_avx2(_local_1c40,8);
            auVar79 = vpor_avx2(auVar110,auVar79);
            local_1bc0._24_8_ = ptr_02[(long)local_17f0 + 3];
            local_1bc0._0_24_ = auVar79._0_24_;
            auVar110 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffe3b0),8);
            auVar79 = vpsrldq_avx2(_local_1c60,8);
            auVar79 = vpor_avx2(auVar110,auVar79);
            local_1be0._24_8_ = ptr_03[(long)local_17f0 + 3];
            local_1be0._0_24_ = auVar79._0_24_;
            auVar110 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffe390),8);
            auVar79 = vpsrldq_avx2(_local_1c80,8);
            auVar79 = vpor_avx2(auVar110,auVar79);
            local_1c00._24_8_ = ptr_04[(long)local_17f0 + 3];
            local_1c00._0_24_ = auVar79._0_24_;
            auVar110 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffe2b0),8);
            auVar79 = vpsrldq_avx2(_local_1d60,8);
            auVar79 = vpor_avx2(auVar110,auVar79);
            auVar111 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffe250),8);
            auVar110 = vpsrldq_avx2(_local_1dc0,8);
            auVar110 = vpor_avx2(auVar111,auVar110);
            iVar3 = ptr_06[(long)local_17f0 + 3];
            auVar112 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffe230),8);
            auVar111 = vpsrldq_avx2(_local_1de0,8);
            auVar111 = vpor_avx2(auVar112,auVar111);
            iVar4 = ptr_07[(long)local_17f0 + 3];
            auVar113 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffe210),8);
            auVar112 = vpsrldq_avx2(_local_1e00,8);
            auVar112 = vpor_avx2(auVar113,auVar112);
            iVar5 = ptr_08[(long)local_17f0 + 3];
            auVar14._24_8_ = ptr_01[(long)local_17f0 + 3];
            auVar14._0_24_ = local_1ba0._0_24_;
            auVar13._16_8_ = uStack_15d0;
            auVar13._0_16_ = auVar71;
            auVar13._24_8_ = uStack_15c8;
            auVar113 = vpsubq_avx2(auVar14,auVar13);
            auVar12._24_8_ = ptr_05[(long)local_17f0 + 3];
            auVar12._0_24_ = auVar79._0_24_;
            auVar11._16_8_ = uStack_1590;
            auVar11._0_16_ = auVar72;
            auVar11._24_8_ = uStack_1588;
            auVar79 = vpsubq_avx2(auVar12,auVar11);
            local_1d80 = auVar113._0_8_;
            lStack_1d78 = auVar113._8_8_;
            lStack_1d70 = auVar113._16_8_;
            lStack_1d68 = auVar113._24_8_;
            a[1] = lVar57;
            a[0] = lVar55;
            a[2] = lVar127;
            a[3]._0_4_ = in_stack_ffffffffffffe050;
            a[3]._4_4_ = iVar54;
            b[1] = lVar60;
            b[0] = lVar126;
            b[2]._0_4_ = in_stack_ffffffffffffe028;
            b[2]._4_4_ = in_stack_ffffffffffffe02c;
            b[3] = iVar58;
            _mm256_max_epi64_rpl(a,b);
            local_1d60._8_8_ = lStack_1d78;
            local_1d60._0_8_ = local_1d80;
            local_1d60._16_8_ = lStack_1d70;
            lStack_1d48 = lStack_1d68;
            auVar79 = vpcmpgtq_avx2(auVar113,auVar79);
            auVar37._24_8_ = iVar3;
            auVar37._0_24_ = auVar110._0_24_;
            auVar36._24_8_ = local_1bc0._24_8_;
            auVar36._0_24_ = local_1bc0._0_24_;
            _local_1dc0 = vpblendvb_avx2(auVar37,auVar36,auVar79);
            auVar35._24_8_ = iVar4;
            auVar35._0_24_ = auVar111._0_24_;
            auVar34._24_8_ = local_1be0._24_8_;
            auVar34._0_24_ = local_1be0._0_24_;
            _local_1de0 = vpblendvb_avx2(auVar35,auVar34,auVar79);
            auVar33._24_8_ = iVar5;
            auVar33._0_24_ = auVar112._0_24_;
            auVar32._24_8_ = local_1c00._24_8_;
            auVar32._0_24_ = local_1c00._0_24_;
            auVar79 = vpblendvb_avx2(auVar33,auVar32,auVar79);
            auVar42._16_8_ = uStack_1510;
            auVar42._0_16_ = auVar89;
            auVar42._24_8_ = uStack_1508;
            _local_1e00 = vpaddq_avx2(auVar79,auVar42);
            auVar113._16_8_ = uStack_15d0;
            auVar113._0_16_ = auVar71;
            auVar113._24_8_ = uStack_15c8;
            auVar79 = vpsubq_avx2(_local_1c20,auVar113);
            auVar111._16_8_ = uStack_1590;
            auVar111._0_16_ = auVar72;
            auVar111._24_8_ = uStack_1588;
            auVar110 = vpsubq_avx2(local_1ca0,auVar111);
            local_1cc0 = auVar79._0_8_;
            uStack_1cb8 = auVar79._8_8_;
            uStack_1cb0 = auVar79._16_8_;
            uStack_1ca8 = auVar79._24_8_;
            a_00[1] = lVar57;
            a_00[0] = lVar55;
            a_00[2] = lVar127;
            a_00[3]._0_4_ = in_stack_ffffffffffffe050;
            a_00[3]._4_4_ = iVar54;
            b_00[1] = lVar60;
            b_00[0] = lVar126;
            b_00[2]._0_4_ = in_stack_ffffffffffffe028;
            b_00[2]._4_4_ = in_stack_ffffffffffffe02c;
            b_00[3] = iVar58;
            _mm256_max_epi64_rpl(a_00,b_00);
            local_1ca0._8_8_ = uStack_1cb8;
            local_1ca0._0_8_ = local_1cc0;
            auVar79 = vpcmpgtq_avx2(auVar79,auVar110);
            auVar110 = vpblendvb_avx2(local_1d00,_local_1c40,auVar79);
            auVar111 = vpblendvb_avx2(local_1d20,_local_1c60,auVar79);
            auVar79 = vpblendvb_avx2(local_1d40,_local_1c80,auVar79);
            auVar41._16_8_ = uStack_1510;
            auVar41._0_16_ = auVar89;
            auVar41._24_8_ = uStack_1508;
            auVar79 = vpaddq_avx2(auVar79,auVar41);
            auVar113 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffe1b0),8);
            auVar112 = vpsrldq_avx2(_local_1e60,8);
            auVar113 = vpor_avx2(auVar113,auVar112);
            lStack_1e48 = ptr_00[(long)local_17f0 + 3];
            local_1e60 = auVar113._0_24_;
            auVar11 = _local_1e60;
            auVar78._8_8_ = 0;
            auVar78._0_8_ = (long)*(int *)(lVar1 + ptr_00[(long)(local_17f0 + -3) + 3] * 4);
            auVar106._8_8_ = 0;
            auVar106._0_8_ =
                 (long)*(int *)(lVar2 + lVar66 * 4 + ptr_00[(long)(local_17f0 + -2) + 3] * 4);
            auVar83 = vpunpcklqdq_avx(auVar78,auVar106);
            auVar107._8_8_ = 0;
            auVar107._0_8_ = (long)*(int *)(lVar61 + ptr_00[(long)(local_17f0 + -1) + 3] * 4);
            auVar124._8_8_ = 0;
            auVar124._0_8_ = (long)*(int *)(lVar59 + ptr_00[(long)local_17f0 + 3] * 4);
            auVar74 = vpunpcklqdq_avx(auVar107,auVar124);
            uStack_1390 = auVar74._0_8_;
            uStack_1388 = auVar74._8_8_;
            auVar40._16_8_ = uStack_1390;
            auVar40._0_16_ = auVar83;
            auVar40._24_8_ = uStack_1388;
            auVar109 = vpaddq_avx2(auVar109,auVar40);
            local_1ec0 = auVar109._0_8_;
            lStack_1eb8 = auVar109._8_8_;
            lStack_1eb0 = auVar109._16_8_;
            lStack_1ea8 = auVar109._24_8_;
            a_01[1] = lVar57;
            a_01[0] = lVar55;
            a_01[2] = lVar127;
            a_01[3]._0_4_ = in_stack_ffffffffffffe050;
            a_01[3]._4_4_ = iVar54;
            b_01[1] = lVar60;
            b_01[0] = lVar126;
            b_01[2]._0_4_ = in_stack_ffffffffffffe028;
            b_01[2]._4_4_ = in_stack_ffffffffffffe02c;
            b_01[3] = iVar58;
            local_1c20._0_8_ = local_1ec0;
            local_1c20._8_8_ = lStack_1eb8;
            lVar65 = lStack_1eb0;
            lVar85 = lStack_1ea8;
            _mm256_max_epi64_rpl(a_01,b_01);
            a_02[1] = lVar57;
            a_02[0] = lVar55;
            a_02[2] = lVar127;
            a_02[3]._0_4_ = in_stack_ffffffffffffe050;
            a_02[3]._4_4_ = iVar54;
            b_02[1] = lVar60;
            b_02[0] = lVar126;
            b_02[2]._0_4_ = in_stack_ffffffffffffe028;
            b_02[2]._4_4_ = in_stack_ffffffffffffe02c;
            b_02[3] = iVar58;
            _mm256_max_epi64_rpl(a_02,b_02);
            lVar81 = -(ulong)(lVar65 == lStack_1eb0);
            lVar86 = -(ulong)(lVar85 == lStack_1ea8);
            local_1b60._8_8_ = -(ulong)(local_1c20._8_8_ == lStack_1eb8);
            local_1b60._0_8_ = -(ulong)(local_1c20._0_8_ == local_1ec0);
            lVar67 = -(ulong)(local_1c20._0_8_ == local_1d80);
            lVar80 = -(ulong)(local_1c20._8_8_ == lStack_1d78);
            lVar82 = -(ulong)(lVar65 == lStack_1d70);
            lVar87 = -(ulong)(lVar85 == lStack_1d68);
            auVar31._8_8_ = lVar80;
            auVar31._0_8_ = lVar67;
            auVar31._16_8_ = lVar82;
            auVar31._24_8_ = lVar87;
            auVar112 = vpblendvb_avx2(auVar110,_local_1dc0,auVar31);
            local_1e60._0_8_ = auVar113._0_8_;
            local_1e60._8_8_ = auVar113._8_8_;
            local_1e60._16_8_ = auVar113._16_8_;
            auVar47._8_8_ = -(ulong)(lStack_1e38 == local_1e60._8_8_);
            auVar47._0_8_ = -(ulong)(local_1e40 == local_1e60._0_8_);
            auVar47._16_8_ = -(ulong)(lStack_1e30 == local_1e60._16_8_);
            auVar47._24_8_ = -(ulong)(lStack_1e28 == lStack_1e48);
            auVar46._16_8_ = uStack_1510;
            auVar46._0_16_ = auVar89;
            auVar46._24_8_ = uStack_1508;
            auVar109 = vpand_avx2(auVar47,auVar46);
            auVar6 = vpaddq_avx2(auVar6,auVar109);
            auVar30._16_8_ = lVar81;
            auVar30._0_16_ = local_1b60;
            auVar30._24_8_ = lVar86;
            auVar109 = vpblendvb_avx2(auVar112,auVar6,auVar30);
            auVar29._8_8_ = lVar80;
            auVar29._0_8_ = lVar67;
            auVar29._16_8_ = lVar82;
            auVar29._24_8_ = lVar87;
            auVar112 = vpblendvb_avx2(auVar111,_local_1de0,auVar29);
            auVar20._16_8_ = uStack_1390;
            auVar20._0_16_ = auVar83;
            auVar20._24_8_ = uStack_1388;
            auVar19._16_8_ = uStack_1550;
            auVar19._0_16_ = auVar88;
            auVar19._24_8_ = uStack_1548;
            auVar6 = vpcmpgtq_avx2(auVar20,auVar19);
            auVar45._16_8_ = uStack_1510;
            auVar45._0_16_ = auVar89;
            auVar45._24_8_ = uStack_1508;
            auVar6 = vpand_avx2(auVar6,auVar45);
            auVar7 = vpaddq_avx2(auVar7,auVar6);
            auVar28._16_8_ = lVar81;
            auVar28._0_16_ = local_1b60;
            auVar28._24_8_ = lVar86;
            auVar7 = vpblendvb_avx2(auVar112,auVar7,auVar28);
            auVar27._8_8_ = lVar80;
            auVar27._0_8_ = lVar67;
            auVar27._16_8_ = lVar82;
            auVar27._24_8_ = lVar87;
            auVar6 = vpblendvb_avx2(auVar79,_local_1e00,auVar27);
            auVar39._16_8_ = uStack_1510;
            auVar39._0_16_ = auVar89;
            auVar39._24_8_ = uStack_1508;
            auVar8 = vpaddq_avx2(auVar8,auVar39);
            auVar26._16_8_ = lVar81;
            auVar26._0_16_ = local_1b60;
            auVar26._24_8_ = lVar86;
            auVar8 = vpblendvb_avx2(auVar6,auVar8,auVar26);
            lVar67 = -(ulong)(local_1e20._0_8_ == local_1460);
            lVar80 = -(ulong)(local_1e20._8_8_ == lStack_1458);
            lVar81 = -(ulong)(local_1e20._16_8_ == lStack_1450);
            lVar82 = -(ulong)(local_1e20._24_8_ == lStack_1448);
            auVar25._16_8_ = lVar65;
            auVar25._0_16_ = local_1c20._0_16_;
            auVar25._24_8_ = lVar85;
            auVar24._8_8_ = lVar80;
            auVar24._0_8_ = lVar67;
            auVar24._16_8_ = lVar81;
            auVar24._24_8_ = lVar82;
            _local_1c20 = vpblendvb_avx2(auVar25,local_1b40,auVar24);
            auVar112._8_8_ = lVar80;
            auVar112._0_8_ = lVar67;
            auVar112._16_8_ = lVar81;
            auVar112._24_8_ = lVar82;
            auVar6 = vpcmpeqd_avx2(auVar112,auVar112);
            _local_1c40 = vpandn_avx2(auVar112,auVar109);
            auVar52._8_8_ = lVar80;
            auVar52._0_8_ = lVar67;
            auVar52._16_8_ = lVar81;
            auVar52._24_8_ = lVar82;
            _local_1c60 = vpandn_avx2(auVar52,auVar7);
            auVar51._8_8_ = lVar80;
            auVar51._0_8_ = lVar67;
            auVar51._16_8_ = lVar81;
            auVar51._24_8_ = lVar82;
            _local_1c80 = vpandn_avx2(auVar51,auVar8);
            auVar23._16_8_ = uStack_1cb0;
            auVar23._0_16_ = local_1ca0._0_16_;
            auVar23._24_8_ = uStack_1ca8;
            auVar22._16_8_ = uStack_1610;
            auVar22._0_16_ = auVar70;
            auVar22._24_8_ = uStack_1608;
            auVar21._8_8_ = lVar80;
            auVar21._0_8_ = lVar67;
            auVar21._16_8_ = lVar81;
            auVar21._24_8_ = lVar82;
            local_1ca0 = vpblendvb_avx2(auVar23,auVar22,auVar21);
            auVar50._8_8_ = lVar80;
            auVar50._0_8_ = lVar67;
            auVar50._16_8_ = lVar81;
            auVar50._24_8_ = lVar82;
            local_1d00 = vpandn_avx2(auVar50,auVar110);
            auVar49._8_8_ = lVar80;
            auVar49._0_8_ = lVar67;
            auVar49._16_8_ = lVar81;
            auVar49._24_8_ = lVar82;
            local_1d20 = vpandn_avx2(auVar49,auVar111);
            auVar48._8_8_ = lVar80;
            auVar48._0_8_ = lVar67;
            auVar48._16_8_ = lVar81;
            auVar48._24_8_ = lVar82;
            local_1d40 = vpand_avx2(auVar48 ^ auVar6,auVar79);
            if (3 < local_17f0) {
              a_03[1] = lVar57;
              a_03[0] = lVar55;
              a_03[2] = lVar127;
              a_03[3]._0_4_ = in_stack_ffffffffffffe050;
              a_03[3]._4_4_ = iVar54;
              b_03[1] = lVar60;
              b_03[0] = lVar126;
              b_03[2]._0_4_ = in_stack_ffffffffffffe028;
              b_03[2]._4_4_ = in_stack_ffffffffffffe02c;
              b_03[3] = iVar58;
              _mm256_min_epi64_rpl(a_03,b_03);
              a_04[1] = lVar57;
              a_04[0] = lVar55;
              a_04[2] = lVar127;
              a_04[3]._0_4_ = in_stack_ffffffffffffe050;
              a_04[3]._4_4_ = iVar54;
              b_04[1] = lVar60;
              b_04[0] = lVar126;
              b_04[2]._0_4_ = in_stack_ffffffffffffe028;
              b_04[2]._4_4_ = in_stack_ffffffffffffe02c;
              b_04[3] = iVar58;
              _mm256_max_epi64_rpl(a_04,b_04);
              a_05[1] = lVar57;
              a_05[0] = lVar55;
              a_05[2] = lVar127;
              a_05[3]._0_4_ = in_stack_ffffffffffffe050;
              a_05[3]._4_4_ = iVar54;
              b_05[1] = lVar60;
              b_05[0] = lVar126;
              b_05[2]._0_4_ = in_stack_ffffffffffffe028;
              b_05[2]._4_4_ = in_stack_ffffffffffffe02c;
              b_05[3] = iVar58;
              _mm256_max_epi64_rpl(a_05,b_05);
              a_06[1] = lVar57;
              a_06[0] = lVar55;
              a_06[2] = lVar127;
              a_06[3]._0_4_ = in_stack_ffffffffffffe050;
              a_06[3]._4_4_ = iVar54;
              b_06[1] = lVar60;
              b_06[0] = lVar126;
              b_06[2]._0_4_ = in_stack_ffffffffffffe028;
              b_06[2]._4_4_ = in_stack_ffffffffffffe02c;
              b_06[3] = iVar58;
              _mm256_max_epi64_rpl(a_06,b_06);
              a_07[1] = lVar57;
              a_07[0] = lVar55;
              a_07[2] = lVar127;
              a_07[3]._0_4_ = in_stack_ffffffffffffe050;
              a_07[3]._4_4_ = iVar54;
              b_07[1] = lVar60;
              b_07[0] = lVar126;
              b_07[2]._0_4_ = in_stack_ffffffffffffe028;
              b_07[2]._4_4_ = in_stack_ffffffffffffe02c;
              b_07[3] = iVar58;
              _mm256_max_epi64_rpl(a_07,b_07);
              a_08[1] = lVar57;
              a_08[0] = lVar55;
              a_08[2] = lVar127;
              a_08[3]._0_4_ = in_stack_ffffffffffffe050;
              a_08[3]._4_4_ = iVar54;
              b_08[1] = lVar60;
              b_08[0] = lVar126;
              b_08[2]._0_4_ = in_stack_ffffffffffffe028;
              b_08[2]._4_4_ = in_stack_ffffffffffffe02c;
              b_08[3] = iVar58;
              _mm256_max_epi64_rpl(a_08,b_08);
            }
            vWH_00[1] = lVar63;
            vWH_00[0] = lVar125;
            vWH_00[2]._0_4_ = in_stack_ffffffffffffdfe8;
            vWH_00[2]._4_4_ = in_stack_ffffffffffffdfec;
            vWH_00[3] = iVar62;
            arr_store_si256(array,vWH_00,(int32_t)((ulong)iVar64 >> 0x20),(int32_t)iVar64,
                            in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8);
            vWH_01[1] = lVar63;
            vWH_01[0] = lVar125;
            vWH_01[2]._0_4_ = in_stack_ffffffffffffdfe8;
            vWH_01[2]._4_4_ = in_stack_ffffffffffffdfec;
            vWH_01[3] = iVar62;
            arr_store_si256(array,vWH_01,(int32_t)((ulong)iVar64 >> 0x20),(int32_t)iVar64,
                            in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8);
            vWH_02[1] = lVar63;
            vWH_02[0] = lVar125;
            vWH_02[2]._0_4_ = in_stack_ffffffffffffdfe8;
            vWH_02[2]._4_4_ = in_stack_ffffffffffffdfec;
            vWH_02[3] = iVar62;
            arr_store_si256(array,vWH_02,(int32_t)((ulong)iVar64 >> 0x20),(int32_t)iVar64,
                            in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8);
            vWH_03[1] = lVar63;
            vWH_03[0] = lVar125;
            vWH_03[2]._0_4_ = in_stack_ffffffffffffdfe8;
            vWH_03[2]._4_4_ = in_stack_ffffffffffffdfec;
            vWH_03[3] = iVar62;
            arr_store_si256(array,vWH_03,(int32_t)((ulong)iVar64 >> 0x20),(int32_t)iVar64,
                            in_stack_ffffffffffffdfcc,in_stack_ffffffffffffdfc8);
            ptr_01[(long)(local_17f0 + -3) + 3] = local_1c20._0_8_;
            ptr_02[(long)(local_17f0 + -3) + 3] = local_1c40._0_8_;
            ptr_03[(long)(local_17f0 + -3) + 3] = local_1c60._0_8_;
            ptr_04[(long)(local_17f0 + -3) + 3] = local_1c80._0_8_;
            ptr_05[(long)(local_17f0 + -3) + 3] = local_1d80;
            ptr_06[(long)(local_17f0 + -3) + 3] = local_1dc0._0_8_;
            ptr_07[(long)(local_17f0 + -3) + 3] = local_1de0._0_8_;
            ptr_08[(long)(local_17f0 + -3) + 3] = local_1e00._0_8_;
            local_1ae0 = auVar9._0_8_;
            lStack_1ad8 = auVar9._8_8_;
            lStack_1ad0 = auVar9._16_8_;
            lStack_1ac8 = auVar9._24_8_;
            local_1b20 = auVar10._0_8_;
            lStack_1b18 = auVar10._8_8_;
            lStack_1b10 = auVar10._16_8_;
            lStack_1b08 = auVar10._24_8_;
            auVar44._8_8_ = -(ulong)(local_1a00._8_8_ == lStack_1ad8);
            auVar44._0_8_ = -(ulong)(local_1a00._0_8_ == local_1ae0);
            auVar44._16_8_ = -(ulong)(local_1a00._16_8_ == lStack_1ad0);
            auVar44._24_8_ = -(ulong)(local_1a00._24_8_ == lStack_1ac8);
            auVar43._8_8_ = -(ulong)(local_1e20._8_8_ == lStack_1b18);
            auVar43._0_8_ = -(ulong)(local_1e20._0_8_ == local_1b20);
            auVar43._16_8_ = -(ulong)(local_1e20._16_8_ == lStack_1b10);
            auVar43._24_8_ = -(ulong)(local_1e20._24_8_ == lStack_1b08);
            auVar8 = vpand_avx2(auVar44,auVar43);
            local_1a40 = vpblendvb_avx2(local_1a40,_local_1c20,auVar8);
            local_1a60 = vpblendvb_avx2(local_1a60,_local_1c40,auVar8);
            local_1a80 = vpblendvb_avx2(local_1a80,_local_1c60,auVar8);
            local_1aa0 = vpblendvb_avx2(local_1aa0,_local_1c80,auVar8);
            auVar38._16_8_ = uStack_1510;
            auVar38._0_16_ = auVar89;
            auVar38._24_8_ = uStack_1508;
            local_1e20 = vpaddq_avx2(local_1e20,auVar38);
            local_17f0 = local_17f0 + 1;
            _local_1e60 = auVar11;
          }
          auVar110._16_8_ = uStack_14d0;
          auVar110._0_16_ = auVar90;
          auVar110._24_8_ = uStack_14c8;
          local_1a00 = vpaddq_avx2(local_1a00,auVar110);
          auVar79._16_8_ = uStack_1490;
          auVar79._0_16_ = auVar73;
          auVar79._24_8_ = uStack_1488;
          local_1b40 = vpsubq_avx2(local_1b40,auVar79);
        }
        local_17ec = 0;
        local_1820 = local_1828;
        local_1818 = local_1828;
        local_1810 = local_1828;
        while( true ) {
          if (3 < local_17ec) break;
          if ((long)local_1810 < (long)local_1a40._24_8_) {
            local_1810 = local_1a40._24_8_;
            local_1818 = local_1a60._24_8_;
            local_1820 = local_1a80._24_8_;
            local_1828 = local_1aa0._24_8_;
          }
          auVar70 = ZEXT816(0) << 0x40;
          auVar9 = vpermq_avx2(local_1a40,0x90);
          local_1a40 = vpblendd_avx2(auVar9,ZEXT1632(auVar70),3);
          auVar9 = vpermq_avx2(local_1a60,0x90);
          local_1a60 = vpblendd_avx2(auVar9,ZEXT1632(auVar70),3);
          auVar9 = vpermq_avx2(local_1a80,0x90);
          local_1a80 = vpblendd_avx2(auVar9,ZEXT1632(auVar70),3);
          auVar9 = vpermq_avx2(local_1aa0,0x90);
          local_1aa0 = vpblendd_avx2(auVar9,ZEXT1632(auVar70),3);
          local_17ec = local_17ec + 1;
        }
        auVar18._16_8_ = uStack_1690;
        auVar18._0_16_ = auVar68;
        auVar18._24_8_ = uStack_1688;
        auVar17._8_8_ = uStack_1898;
        auVar17._0_8_ = local_18a0;
        auVar17._16_8_ = uStack_1890;
        auVar17._24_8_ = uStack_1888;
        auVar9 = vpcmpgtq_avx2(auVar18,auVar17);
        auVar16._8_8_ = uStack_18b8;
        auVar16._0_8_ = local_18c0;
        auVar16._16_8_ = uStack_18b0;
        auVar16._24_8_ = uStack_18a8;
        auVar15._16_8_ = uStack_1650;
        auVar15._0_16_ = auVar69;
        auVar15._24_8_ = uStack_1648;
        auVar10 = vpcmpgtq_avx2(auVar16,auVar15);
        auVar9 = vpor_avx2(auVar9,auVar10);
        if ((((((((((((((((((((((((((((((((auVar9 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar9 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar9 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar9 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar9 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar9 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar9 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   ) || (auVar9 >> 0x47 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                 (auVar9 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                || (auVar9 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (auVar9 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (auVar9 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar9 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar9 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar9 >> 0x7f,0) != '\0') ||
                          (auVar9 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar9 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar9 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar9 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar9 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar9 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar9 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar9 >> 0xbf,0) != '\0') ||
                  (auVar9 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar9 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar9 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar9 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar9 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar9 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar9 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            auVar9[0x1f] < '\0') {
          local_1708->flag = local_1708->flag | 0x40;
          local_1810 = 0;
          local_1818._0_4_ = 0;
          local_1820._0_4_ = 0;
          local_1828._0_4_ = 0;
          local_17f4 = 0;
          local_17f8 = 0;
        }
        local_1708->score = (int)local_1810;
        local_1708->end_query = local_17f4;
        local_1708->end_ref = local_17f8;
        ((local_1708->field_4).stats)->matches = (int)local_1818;
        ((local_1708->field_4).stats)->similar = (int)local_1820;
        ((local_1708->field_4).stats)->length = (int)local_1828;
        parasail_free(ptr_08);
        parasail_free(ptr_07);
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
      }
    }
  }
  return local_1708;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vNegInf0;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm256_set1_epi64x_rpl(open);
    vGap  = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_set1_epi64x_rpl(0);
    vNegInf0 = _mm256_insert_epi64_rpl(vZero, NEG_LIMIT, 3);
    vOne = _mm256_set1_epi64x_rpl(1);
    vN = _mm256_set1_epi64x_rpl(N);
    vGapN = _mm256_set1_epi64x_rpl(gap*N);
    vNegOne = _mm256_set1_epi64x_rpl(-1);
    vI = _mm256_set_epi64x_rpl(0,1,2,3);
    vJreset = _mm256_set_epi64x_rpl(0,-1,-2,-3);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vILimit = _mm256_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm256_sub_epi64(vILimit, vOne);
    vJLimit = _mm256_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm256_sub_epi64(vJLimit, vOne);
    vIBoundary = _mm256_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(32, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(32, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i case1 = vZero;
        __m256i case2 = vZero;
        __m256i vNH = vZero;
        __m256i vNM = vZero;
        __m256i vNS = vZero;
        __m256i vNL = vZero;
        __m256i vWH = vZero;
        __m256i vWM = vZero;
        __m256i vWS = vZero;
        __m256i vWL = vZero;
        __m256i vE = vNegInf0;
        __m256i vE_opn = vNegInf;
        __m256i vE_ext = vNegInf;
        __m256i vEM = vZero;
        __m256i vES = vZero;
        __m256i vEL = vZero;
        __m256i vF = vNegInf0;
        __m256i vF_opn = vNegInf;
        __m256i vF_ext = vNegInf;
        __m256i vFM = vZero;
        __m256i vFS = vZero;
        __m256i vFL = vZero;
        __m256i vJ = vJreset;
        __m256i vs1 = _mm256_set_epi64x_rpl(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3]);
        __m256i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        vNH = _mm256_insert_epi64_rpl(vNH, H_pr[-1], 3);
        vWH = _mm256_insert_epi64_rpl(vWH, -open - i*gap, 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            __m256i vNWM = vNM;
            __m256i vNWS = vNS;
            __m256i vNWL = vNL;
            vNH = _mm256_srli_si256_rpl(vWH, 8);
            vNH = _mm256_insert_epi64_rpl(vNH, H_pr[j], 3);
            vNM = _mm256_srli_si256_rpl(vWM, 8);
            vNM = _mm256_insert_epi64_rpl(vNM, HM_pr[j], 3);
            vNS = _mm256_srli_si256_rpl(vWS, 8);
            vNS = _mm256_insert_epi64_rpl(vNS, HS_pr[j], 3);
            vNL = _mm256_srli_si256_rpl(vWL, 8);
            vNL = _mm256_insert_epi64_rpl(vNL, HL_pr[j], 3);
            vF = _mm256_srli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, F_pr[j], 3);
            vFM = _mm256_srli_si256_rpl(vFM, 8);
            vFM = _mm256_insert_epi64_rpl(vFM, FM_pr[j], 3);
            vFS = _mm256_srli_si256_rpl(vFS, 8);
            vFS = _mm256_insert_epi64_rpl(vFS, FS_pr[j], 3);
            vFL = _mm256_srli_si256_rpl(vFL, 8);
            vFL = _mm256_insert_epi64_rpl(vFL, FL_pr[j], 3);
            vF_opn = _mm256_sub_epi64(vNH, vOpen);
            vF_ext = _mm256_sub_epi64(vF, vGap);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vNM, case1);
            vFS = _mm256_blendv_epi8(vFS, vNS, case1);
            vFL = _mm256_blendv_epi8(vFL, vNL, case1);
            vFL = _mm256_add_epi64(vFL, vOne);
            vE_opn = _mm256_sub_epi64(vWH, vOpen);
            vE_ext = _mm256_sub_epi64(vE, vGap);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vWM, case1);
            vES = _mm256_blendv_epi8(vES, vWS, case1);
            vEL = _mm256_blendv_epi8(vEL, vWL, case1);
            vEL = _mm256_add_epi64(vEL, vOne);
            vs2 = _mm256_srli_si256_rpl(vs2, 8);
            vs2 = _mm256_insert_epi64_rpl(vs2, s2[j], 3);
            vMat = _mm256_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm256_add_epi64(vNWH, vMat);
            vWH = _mm256_max_epi64_rpl(vNWH, vE);
            vWH = _mm256_max_epi64_rpl(vWH, vF);
            case1 = _mm256_cmpeq_epi64(vWH, vNWH);
            case2 = _mm256_cmpeq_epi64(vWH, vF);
            vWM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi64(vNWM,
                        _mm256_and_si256(
                            _mm256_cmpeq_epi64(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi64(vNWS,
                        _mm256_and_si256(
                            _mm256_cmpgt_epi64(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi64(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vWM = _mm256_andnot_si256(cond, vWM);
                vWS = _mm256_andnot_si256(cond, vWS);
                vWL = _mm256_andnot_si256(cond, vWL);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm256_andnot_si256(cond, vEM);
                vES = _mm256_andnot_si256(cond, vES);
                vEL = _mm256_andnot_si256(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWH,0);
            HM_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWM,0);
            HS_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWS,0);
            HL_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWL,0);
            F_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vF,0);
            FM_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFM,0);
            FS_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFS,0);
            FL_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m256i cond_valid_I = _mm256_cmpeq_epi64(vI, vILimit1);
                __m256i cond_valid_J = _mm256_cmpeq_epi64(vJ, vJLimit1);
                __m256i cond_all = _mm256_and_si256(cond_valid_I, cond_valid_J);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm256_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm256_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm256_blendv_epi8(vMaxL, vWL, cond_all);
            }
            vJ = _mm256_add_epi64(vJ, vOne);
        }
        vI = _mm256_add_epi64(vI, vN);
        vIBoundary = _mm256_sub_epi64(vIBoundary, vGapN);
    }

    /* max in vMaxH */
    for (i=0; i<N; ++i) {
        int64_t value;
        value = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        if (value > score) {
            score = value;
            matches = (int64_t) _mm256_extract_epi64_rpl(vMaxM, 3);
            similar = (int64_t) _mm256_extract_epi64_rpl(vMaxS, 3);
            length= (int64_t) _mm256_extract_epi64_rpl(vMaxL, 3);
        }
        vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
        vMaxM = _mm256_slli_si256_rpl(vMaxM, 8);
        vMaxS = _mm256_slli_si256_rpl(vMaxS, 8);
        vMaxL = _mm256_slli_si256_rpl(vMaxL, 8);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}